

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-stats.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_23::BinaryReaderOpcnt::OnOpcodeUint32Uint32
          (BinaryReaderOpcnt *this,uint32_t value0,uint32_t value1)

{
  Result RVar1;
  int local_30 [3];
  uint32_t local_24;
  uint32_t array [2];
  uint32_t value1_local;
  uint32_t value0_local;
  BinaryReaderOpcnt *this_local;
  
  local_30[1] = 6;
  local_30[0] = 2;
  local_30[2] = value0;
  local_24 = value1;
  array[0] = value1;
  array[1] = value0;
  RVar1 = (anonymous_namespace)::BinaryReaderOpcnt::
          Emplace<wabt::Opcode&,wabt::OpcodeInfo::Kind,unsigned_int(&)[2],int>
                    ((BinaryReaderOpcnt *)this,&this->current_opcode_,(Kind *)(local_30 + 1),
                     (uint (*) [2])(local_30 + 2),local_30);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderOpcnt::OnOpcodeUint32Uint32(uint32_t value0,
                                               uint32_t value1) {
  uint32_t array[2] = {value0, value1};
  return Emplace(current_opcode_, OpcodeInfo::Kind::Uint32Uint32, array, 2);
}